

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O2

void __thiscall TasgridWrapper::outputQuadrature(TasgridWrapper *this)

{
  int iVar1;
  uint new_num_strips;
  ulong uVar2;
  ulong uVar3;
  Data2D<double> combined;
  vector<double,_std::allocator<double>_> weights;
  vector<double,_std::allocator<double>_> pnts;
  Data2D<double> local_88;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  if (((this->outfilename)._M_string_length != 0) || (this->printCout == true)) {
    new_num_strips = TasGrid::TasmanianSparseGrid::getNumPoints(&this->grid);
    TasGrid::TasmanianSparseGrid::getPoints
              ((vector<double,_std::allocator<double>_> *)&local_48,&this->grid);
    iVar1 = this->num_dimensions;
    TasGrid::TasmanianSparseGrid::getQuadratureWeights
              ((vector<double,_std::allocator<double>_> *)&local_60,&this->grid);
    TasGrid::Data2D<double>::Data2D<int,int>(&local_88,this->num_dimensions + 1,new_num_strips);
    uVar3 = 0;
    uVar2 = (ulong)new_num_strips;
    if ((int)new_num_strips < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      local_88.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[local_88.stride * uVar3] =
           local_60._M_impl.super__Vector_impl_data._M_start[uVar3];
      if (0 < (long)this->num_dimensions) {
        memmove(local_88.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + local_88.stride * uVar3 + 1,
                local_48._M_impl.super__Vector_impl_data._M_start,(long)this->num_dimensions << 3);
      }
      local_48._M_impl.super__Vector_impl_data._M_start =
           local_48._M_impl.super__Vector_impl_data._M_start + iVar1;
    }
    writeMatrix(this,&this->outfilename,new_num_strips,this->num_dimensions + 1,
                local_88.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start);
    printMatrix(this,new_num_strips,this->num_dimensions + 1,
                local_88.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,false);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_88.vec.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void TasgridWrapper::outputQuadrature() const{
    if (outfilename.empty() and not printCout) return;
    int num_points = grid.getNumPoints();
    auto pnts  = grid.getPoints();
    Utils::Wrapper2D<double> points(num_dimensions, pnts.data());
    auto weights = grid.getQuadratureWeights();
    Data2D<double> combined(num_dimensions + 1, num_points);
    for(int i=0; i<num_points; i++){
        combined.getStrip(i)[0] = weights[i];
        std::copy_n(points.getStrip(i), num_dimensions, &(combined.getStrip(i)[1]));
    }
    writeMatrix(outfilename, num_points, num_dimensions+1, combined.getStrip(0));
    printMatrix(num_points, num_dimensions+1, combined.getStrip(0));
}